

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManPoXSim(Gia_Man_t *p,int nFrames,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  undefined1 auVar5 [16];
  Vec_Int_t *pVVar6;
  int *__ptr;
  int iVar7;
  int iVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  char *__format;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t __size;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong local_50;
  int **local_40;
  
  uVar18 = (long)p->vCos->nSize - (long)p->nRegs;
  local_50 = uVar18 & 0xffffffff;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar8 = (int)uVar18;
  iVar20 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar20 = iVar8;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar20;
  if (iVar20 == 0) {
    pVVar6->pArray = (int *)0x0;
    if (0 < iVar8) {
      __size = local_50 << 2;
LAB_00244d67:
      __ptr = (int *)malloc(__size);
      goto LAB_00244d6f;
    }
  }
  else {
    __ptr = (int *)malloc((long)iVar20 << 2);
    pVVar6->pArray = __ptr;
    if (iVar20 < iVar8) {
      __size = uVar18 * 4;
      if (__ptr == (int *)0x0) goto LAB_00244d67;
      __ptr = (int *)realloc(__ptr,__size);
LAB_00244d6f:
      pVVar6->pArray = __ptr;
      if (__ptr == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar6->nCap = iVar8;
    }
    auVar5 = _DAT_0093d220;
    if (0 < iVar8) {
      lVar11 = local_50 - 1;
      auVar19._8_4_ = (int)lVar11;
      auVar19._0_8_ = lVar11;
      auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar12 = 0;
      auVar19 = auVar19 ^ _DAT_0093d220;
      auVar21 = _DAT_0093e4e0;
      auVar22 = _DAT_0093d210;
      do {
        auVar23 = auVar22 ^ auVar5;
        iVar20 = auVar19._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar20 && auVar19._0_4_ < auVar23._0_4_ ||
                    iVar20 < auVar23._4_4_) & 1)) {
          __ptr[uVar12] = nFrames;
        }
        if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
            auVar23._12_4_ <= auVar19._12_4_) {
          __ptr[uVar12 + 1] = nFrames;
        }
        auVar23 = auVar21 ^ auVar5;
        iVar7 = auVar23._4_4_;
        if (iVar7 <= iVar20 && (iVar7 != iVar20 || auVar23._0_4_ <= auVar19._0_4_)) {
          __ptr[uVar12 + 2] = nFrames;
          __ptr[uVar12 + 3] = nFrames;
        }
        uVar12 = uVar12 + 4;
        lVar11 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar11 + 4;
        lVar11 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar11 + 4;
      } while ((iVar8 + 3U & 0xfffffffc) != uVar12);
    }
  }
  local_40 = &pVVar6->pArray;
  pVVar6->nSize = iVar8;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  iVar20 = p->nRegs;
  if (0 < iVar20) {
    iVar7 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar13 = (iVar2 - iVar20) + iVar7;
      if (((int)uVar13 < 0) || (iVar2 <= (int)uVar13)) {
LAB_002454e6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar13];
      lVar11 = (long)iVar2;
      if ((lVar11 < 0) || (p->nObjs <= iVar2)) {
LAB_002454c7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar4 + lVar11) = *(ulong *)(pGVar4 + lVar11) & 0xbfffffffbfffffff | 0x40000000;
      iVar7 = iVar7 + 1;
      iVar20 = p->nRegs;
    } while (iVar7 < iVar20);
  }
  if (nFrames < 1) {
    if (fVerbose == 0) {
      return pVVar6;
    }
    if (iVar8 == 0) {
      iVar7 = 0;
LAB_002454a1:
      nFrames = iVar7 + 1;
      __format = "Simulation converged after %d frames.\n";
      goto LAB_002454ae;
    }
  }
  else {
    iVar7 = 0;
    uVar12 = 0;
    if (0 < iVar8) {
      uVar12 = uVar18 & 0xffffffff;
    }
    do {
      pVVar10 = p->vCis;
      iVar8 = pVVar10->nSize;
      if (iVar20 < iVar8) {
        lVar11 = 0;
        do {
          if (iVar8 <= lVar11) goto LAB_002454e6;
          iVar8 = pVVar10->pArray[lVar11];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002454c7;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar8;
          *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x4000000040000000;
          lVar11 = lVar11 + 1;
          iVar20 = p->nRegs;
          pVVar10 = p->vCis;
          iVar8 = pVVar10->nSize;
        } while (lVar11 < iVar8 - iVar20);
      }
      if (0 < iVar20) {
        iVar8 = 0;
        do {
          iVar2 = p->vCis->nSize;
          uVar13 = iVar8 + (iVar2 - iVar20);
          if (((int)uVar13 < 0) || (iVar2 <= (int)uVar13)) goto LAB_002454e6;
          iVar3 = p->vCis->pArray[uVar13];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_002454c7;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar4 + iVar3;
          uVar18 = *(ulong *)pGVar1;
          if (((~(uint)uVar18 & 0x9fffffff) != 0) ||
             (uVar13 = (uint)(uVar18 >> 0x20) & 0x1fffffff, (int)uVar13 < iVar2 - iVar20)) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar20 = p->vCos->nSize;
          uVar13 = (iVar20 - iVar2) + uVar13;
          if (((int)uVar13 < 0) || (iVar20 <= (int)uVar13)) goto LAB_002454e6;
          uVar13 = p->vCos->pArray[uVar13];
          lVar11 = (long)(int)uVar13;
          if ((lVar11 < 0) || ((uint)p->nObjs <= uVar13)) goto LAB_002454c7;
          if ((*(ulong *)(pGVar4 + lVar11) & 0x4000000040000000) == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3b4,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar14 = *(ulong *)(pGVar4 + lVar11) & 0x40000000;
          *(ulong *)pGVar1 = uVar18 & 0xffffffffbfffffff | uVar14;
          *(ulong *)pGVar1 =
               uVar18 & 0xbfffffffbfffffff | uVar14 |
               *(ulong *)(pGVar4 + lVar11) & 0x4000000000000000;
          iVar8 = iVar8 + 1;
          iVar20 = p->nRegs;
        } while (iVar8 < iVar20);
      }
      iVar8 = p->nObjs;
      if (0 < iVar8) {
        lVar11 = 0;
        lVar9 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar18 = *(ulong *)(&pGVar4->field_0x0 + lVar11);
          uVar13 = (uint)uVar18;
          if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
            uVar14 = *(ulong *)((long)pGVar4 +
                               lVar11 + (ulong)(uint)((int)(uVar18 & 0x1fffffff) << 2) * -3) &
                     0x4000000040000000;
            if (uVar14 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x39c,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar15 = *(ulong *)((long)pGVar4 +
                               lVar11 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3) &
                     0x4000000040000000;
            if (uVar15 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x39d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar16 = 0x4000000000000000;
            uVar17 = uVar16;
            if ((uVar13 >> 0x1d & 1) == 0) {
              uVar17 = 0x40000000;
            }
            if (uVar14 == uVar17) {
LAB_00245185:
              uVar18 = uVar18 & 0xbfffffff3fffffff | 0x40000000;
            }
            else {
              uVar17 = uVar16;
              if ((uVar18 >> 0x3d & 1) == 0) {
                uVar17 = 0x40000000;
              }
              if (uVar15 == uVar17) goto LAB_00245185;
              uVar17 = 0x40000000;
              if ((uVar13 >> 0x1d & 1) == 0) {
                uVar17 = uVar16;
              }
              if ((uVar18 >> 0x3d & 1) != 0) {
                uVar16 = 0x40000000;
              }
              if ((uVar14 == uVar17) && (uVar15 == uVar16)) {
                uVar18 = (uVar18 & 0xbfffffff3fffffff) + 0x4000000000000000;
              }
              else {
                uVar18 = uVar18 | 0x4000000040000000;
              }
            }
            *(ulong *)(&pGVar4->field_0x0 + lVar11) = uVar18;
            iVar8 = p->nObjs;
          }
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + 0xc;
        } while (lVar9 < iVar8);
      }
      pVVar10 = p->vCos;
      if (0 < pVVar10->nSize) {
        lVar11 = 0;
        do {
          iVar8 = pVVar10->pArray[lVar11];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002454c7;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar8;
          uVar18 = *(ulong *)pGVar4;
          uVar13 = (uint)uVar18;
          if ((-1 < (int)uVar13) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3a7,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          uVar14 = *(ulong *)(pGVar4 + -(ulong)(uVar13 & 0x1fffffff)) & 0x4000000040000000;
          if (uVar14 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3a8,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if (((uVar13 >> 0x1d & 1) == 0) || (uVar14 != 0x4000000000000000)) {
            if (uVar14 == 0x4000000000000000) {
              if ((uVar13 >> 0x1d & 1) != 0) goto LAB_002452d0;
LAB_002452b7:
              uVar18 = (uVar18 & 0xbfffffffbfffffff) + 0x4000000000000000;
            }
            else {
              if (uVar14 == 0x40000000) {
                if ((uVar13 >> 0x1d & 1) != 0) goto LAB_002452b7;
                goto LAB_0024527b;
              }
LAB_002452d0:
              uVar18 = uVar18 | 0x4000000040000000;
            }
          }
          else {
LAB_0024527b:
            uVar18 = uVar18 & 0xbfffffffbfffffff | 0x40000000;
          }
          *(ulong *)pGVar4 = uVar18;
          lVar11 = lVar11 + 1;
          pVVar10 = p->vCos;
        } while (lVar11 < pVVar10->nSize);
      }
      iVar20 = p->nRegs;
      if (fVerbose != 0) {
        iVar8 = pVVar10->nSize;
        if (iVar20 < iVar8) {
          lVar11 = 0;
          do {
            if (iVar8 <= lVar11) goto LAB_002454e6;
            iVar8 = pVVar10->pArray[lVar11];
            if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002454c7;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            uVar18 = *(ulong *)(p->pObjs + iVar8);
            iVar8 = 0x30;
            if ((uVar18 & 0x4000000040000000) == 0x40000000) {
LAB_0024538a:
              putchar(iVar8);
              iVar20 = p->nRegs;
              pVVar10 = p->vCos;
            }
            else {
              iVar8 = 0x31;
              if ((((uVar18 >> 0x3e & 1) == 0 | (byte)(uVar18 >> 0x1e) & 1) != 1) ||
                 (iVar8 = 0x58, (((uint)uVar18 & (uint)(uVar18 >> 0x20)) >> 0x1e & 1) == 1))
              goto LAB_0024538a;
            }
            lVar11 = lVar11 + 1;
            iVar8 = pVVar10->nSize;
          } while (lVar11 < iVar8 - iVar20);
        }
        putchar(10);
        pVVar10 = p->vCos;
        iVar20 = p->nRegs;
      }
      iVar8 = pVVar10->nSize;
      if (iVar20 < iVar8) {
        uVar18 = 0;
        do {
          if ((long)iVar8 <= (long)uVar18) goto LAB_002454e6;
          iVar2 = pVVar10->pArray[uVar18];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_002454c7;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar12 == uVar18) goto LAB_002454e6;
          if (((*local_40)[uVar18] == nFrames) &&
             ((~*(ulong *)(p->pObjs + iVar2) & 0x4000000040000000) == 0)) {
            (*local_40)[uVar18] = iVar7;
            local_50 = (ulong)((int)local_50 - 1);
            iVar20 = p->nRegs;
            iVar8 = pVVar10->nSize;
          }
          uVar18 = uVar18 + 1;
        } while ((long)uVar18 < (long)(iVar8 - iVar20));
      }
      if ((int)local_50 == 0) {
        if (fVerbose == 0) {
          return pVVar6;
        }
        goto LAB_002454a1;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != nFrames);
    if (fVerbose == 0) {
      return pVVar6;
    }
  }
  __format = "Simulation terminated after %d frames.\n";
LAB_002454ae:
  printf(__format,(ulong)(uint)nFrames);
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_ManPoXSim( Gia_Man_t * p, int nFrames, int fVerbose )
{
    Vec_Int_t * vRes;
    Gia_Obj_t * pObj;
    int f, k, nLeft = Gia_ManPoNum(p);
    vRes = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntFill( vRes, Gia_ManPoNum(p), nFrames );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            Gia_ObjTerSimSetX( pObj );
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        if ( fVerbose )
        {
            Gia_ManForEachPo( p, pObj, k )
                Gia_ObjTerSimPrint( pObj );
            printf( "\n" );
        }
        Gia_ManForEachPo( p, pObj, k )
            if ( Vec_IntEntry(vRes, k) == nFrames && Gia_ObjTerSimGetX(pObj) )
                Vec_IntWriteEntry(vRes, k, f), nLeft--;
        if ( nLeft == 0 )
            break;
    }
    if ( fVerbose )
    {
        if ( nLeft == 0 )
            printf( "Simulation converged after %d frames.\n", f+1 );
        else
            printf( "Simulation terminated after %d frames.\n", nFrames );
    }        
//    Vec_IntPrint( vRes );
    return vRes;
}